

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O3

PtexCachedReader * __thiscall
Ptex::v2_2::
PtexLruList<Ptex::v2_2::PtexCachedReader,_&Ptex::v2_2::PtexCachedReader::_activeFilesItem>::pop
          (PtexLruList<Ptex::v2_2::PtexCachedReader,_&Ptex::v2_2::PtexCachedReader::_activeFilesItem>
           *this)

{
  PtexLruItem *pPVar1;
  PtexLruItem *pPVar2;
  PtexCachedReader *pPVar3;
  PtexLruItem *pPVar4;
  
  pPVar4 = (this->_end)._next;
  if (pPVar4 == &this->_end) {
    pPVar4 = (PtexLruItem *)0x0;
  }
  else {
    pPVar1 = ((PtexLruItem *)&pPVar4->_prev)->_prev;
    pPVar2 = pPVar4->_next;
    pPVar2->_prev = pPVar1;
    pPVar1->_next = pPVar2;
    ((PtexLruItem *)&pPVar4->_prev)->_prev = pPVar4;
    pPVar4->_next = pPVar4;
  }
  if (PtexLruList<Ptex::v2_2::PtexCachedReader,&Ptex::v2_2::PtexCachedReader::_activeFilesItem>::
      pop()::itemOffset == '\0') {
    PtexLruList<Ptex::v2_2::PtexCachedReader,&Ptex::v2_2::PtexCachedReader::_activeFilesItem>::pop()
    ;
  }
  pPVar3 = (PtexCachedReader *)((long)pPVar4 - pop::itemOffset);
  if (pPVar4 == (PtexLruItem *)0x0) {
    pPVar3 = (PtexCachedReader *)0x0;
  }
  return pPVar3;
}

Assistant:

PtexLruItem* pop() {
        if (_next == this) return 0;
        PtexLruItem* item = _next;
        _next->extract();
        return item;
    }